

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O3

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/array_object.cpp:657:56)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_array_object_cpp:657:56)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  bool bVar1;
  uint32_t uVar2;
  long *plVar3;
  undefined8 *puVar4;
  global_object *this_00;
  object *poVar5;
  uint *puVar6;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar7;
  undefined8 extraout_RDX_02;
  pointer pvVar8;
  value *rhs;
  uint uVar9;
  mjs *this_01;
  _Alloc_hider this_02;
  long lVar10;
  initializer_list<mjs::value> __l;
  initializer_list<mjs::value> __l_00;
  object_ptr o;
  wstring is;
  value callback;
  value res;
  value kval;
  value this_arg;
  bool local_1b0;
  allocator_type local_1a9;
  gc_heap_ptr_untyped local_1a8;
  gc_heap_ptr_untyped local_198;
  wstring local_188;
  value local_168;
  undefined4 local_140;
  double local_138;
  undefined4 local_118;
  gc_heap_ptr_untyped local_110 [2];
  value *local_f0;
  value local_e8;
  vector<mjs::value,_std::allocator<mjs::value>_> local_c0;
  value local_a8;
  value local_80;
  value local_58;
  
  local_198.heap_ = (this->f).global.super_gc_heap_ptr_untyped.heap_;
  local_198.pos_ = (this->f).global.super_gc_heap_ptr_untyped.pos_;
  local_f0 = __return_storage_ptr__;
  if (local_198.heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_198.heap_,&local_198);
  }
  plVar3 = (long *)gc_heap_ptr_untyped::get(&local_198);
  (**(code **)(*plVar3 + 0x88))(&local_1a8,plVar3,this_);
  puVar4 = (undefined8 *)gc_heap_ptr_untyped::get(&local_1a8);
  local_e8.type_ = reference;
  local_e8._4_4_ = 0;
  local_e8.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       (gc_heap *)0x1a89f8;
  (**(code **)*puVar4)(&local_168,puVar4);
  uVar2 = to_uint32(&local_168);
  value::destroy(&local_168);
  pvVar8 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pvVar8 == (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
    pvVar8 = (pointer)&value::undefined;
  }
  value::value(&local_e8,pvVar8);
  this_00 = (global_object *)gc_heap_ptr_untyped::get(&local_198);
  plVar3 = (long *)gc_heap_ptr_untyped::get(&local_198);
  (**(code **)(*plVar3 + 0x60))(&local_168,plVar3);
  global_object::validate_type(this_00,&local_e8,(object_ptr *)&local_168,"function");
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_168);
  pvVar8 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)(((long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pvVar8 >> 3) * -0x3333333333333333) <
      2) {
    rhs = (value *)&value::undefined;
  }
  else {
    rhs = pvVar8 + 1;
  }
  value::value(&local_58,rhs);
  if (uVar2 < 0x10000) {
    this_01 = (mjs *)0x0;
    if (uVar2 == 0) {
      local_1b0 = false;
    }
    else {
      local_1b0 = false;
      uVar7 = extraout_RDX;
      do {
        index_string_abi_cxx11_(&local_188,this_01,(uint32_t)uVar7);
        poVar5 = (object *)gc_heap_ptr_untyped::get(&local_1a8);
        local_168._0_8_ = local_188._M_string_length;
        local_168.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
             (gc_heap *)local_188._M_dataplus._M_p;
        bVar1 = object::has_property(poVar5,(wstring_view *)&local_168);
        if (bVar1) {
          puVar4 = (undefined8 *)gc_heap_ptr_untyped::get(&local_1a8);
          local_168._0_8_ = local_188._M_string_length;
          local_168.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
               (gc_heap *)local_188._M_dataplus._M_p;
          (**(code **)*puVar4)(&local_80,puVar4,&local_168);
          value::value(&local_168,&local_80);
          local_138 = (double)(int)this_01;
          local_140 = 3;
          local_118 = 5;
          local_110[0].heap_ = local_1a8.heap_;
          local_110[0].pos_ = local_1a8.pos_;
          if (local_1a8.heap_ != (gc_heap *)0x0) {
            gc_heap::attach(local_1a8.heap_,local_110);
          }
          __l._M_len = 3;
          __l._M_array = &local_168;
          std::vector<mjs::value,_std::allocator<mjs::value>_>::vector(&local_c0,__l,&local_1a9);
          call_function(&local_a8,&local_e8,&local_58,&local_c0);
          std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector(&local_c0);
          lVar10 = 0x50;
          do {
            value::destroy((value *)((long)&local_168.type_ + lVar10));
            lVar10 = lVar10 + -0x28;
          } while (lVar10 != -0x28);
          bVar1 = to_boolean(&local_a8);
          value::destroy(&local_a8);
          value::destroy(&local_80);
          local_1b0 = (bool)(local_1b0 | bVar1);
          uVar7 = extraout_RDX_01;
        }
        else {
          bVar1 = false;
          uVar7 = extraout_RDX_00;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity * 4 + 4
                         );
          uVar7 = extraout_RDX_02;
        }
        uVar9 = (int)this_01 + 1;
        this_01 = (mjs *)(ulong)uVar9;
      } while (bVar1 == false && uVar9 != uVar2);
    }
  }
  else {
    poVar5 = (object *)gc_heap_ptr_untyped::get(&local_1a8);
    object::enumerable_property_names
              ((vector<mjs::string,_std::allocator<mjs::string>_> *)&local_188,poVar5);
    if (local_188._M_dataplus._M_p == (pointer)local_188._M_string_length) {
      local_1b0 = false;
    }
    else {
      local_1b0 = false;
      this_02._M_p = local_188._M_dataplus._M_p;
      do {
        while( true ) {
          puVar6 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_02._M_p);
          local_168.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
               (gc_heap *)(puVar6 + 1);
          local_168._0_8_ = ZEXT48(*puVar6);
          uVar2 = index_value_from_string((wstring_view *)&local_168);
          if (uVar2 != 0xffffffff) break;
          this_02._M_p = this_02._M_p + 0x10;
          if (this_02._M_p == (pointer)local_188._M_string_length) goto LAB_001431e9;
        }
        puVar4 = (undefined8 *)gc_heap_ptr_untyped::get(&local_1a8);
        puVar6 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_02._M_p);
        local_168.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
             (gc_heap *)(puVar6 + 1);
        local_168._0_8_ = ZEXT48(*puVar6);
        (**(code **)*puVar4)(&local_80,puVar4,&local_168);
        value::value(&local_168,&local_80);
        local_138 = (double)uVar2;
        local_140 = 3;
        local_118 = 5;
        local_110[0].heap_ = local_1a8.heap_;
        local_110[0].pos_ = local_1a8.pos_;
        if (local_1a8.heap_ != (gc_heap *)0x0) {
          gc_heap::attach(local_1a8.heap_,local_110);
        }
        __l_00._M_len = 3;
        __l_00._M_array = &local_168;
        std::vector<mjs::value,_std::allocator<mjs::value>_>::vector(&local_c0,__l_00,&local_1a9);
        call_function(&local_a8,&local_e8,&local_58,&local_c0);
        std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector(&local_c0);
        lVar10 = 0x50;
        do {
          value::destroy((value *)((long)&local_168.type_ + lVar10));
          lVar10 = lVar10 + -0x28;
        } while (lVar10 != -0x28);
        bVar1 = to_boolean(&local_a8);
        value::destroy(&local_a8);
        value::destroy(&local_80);
        local_1b0 = (bool)(local_1b0 | bVar1);
        this_02._M_p = this_02._M_p + 0x10;
      } while (this_02._M_p != (pointer)local_188._M_string_length && !bVar1);
    }
LAB_001431e9:
    std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector
              ((vector<mjs::string,_std::allocator<mjs::string>_> *)&local_188);
  }
  value::destroy(&local_58);
  value::destroy(&local_e8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_1a8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_198);
  local_f0->type_ = boolean;
  (local_f0->field_1).b_ = local_1b0;
  return local_f0;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }